

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_fillreadbuffer(connectdata *conn,size_t bytes,size_t *nreadp)

{
  char **ppcVar1;
  int *piVar2;
  trailers_state tVar3;
  Curl_easy *data_00;
  int iVar4;
  CURLcode CVar5;
  trailers_state tVar6;
  Curl_send_buffer *pCVar7;
  size_t sVar8;
  size_t sVar9;
  code *pcVar10;
  char *pcVar11;
  char *pcVar12;
  Curl_easy *pCVar13;
  size_t sVar14;
  Curl_easy *data;
  curl_slist *trailers;
  char hexbuffer [11];
  
  data_00 = conn->data;
  trailers = (curl_slist *)0x0;
  tVar6 = (data_00->state).trailers_state;
  if (tVar6 == TRAILERS_INITIALIZED) {
    Curl_infof(data_00,"Moving trailers state machine from initialized to sending.\n");
    (data_00->state).trailers_state = TRAILERS_SENDING;
    pCVar7 = Curl_add_buffer_init();
    (data_00->state).trailers_buf = pCVar7;
    if (pCVar7 == (Curl_send_buffer *)0x0) {
      Curl_failf(data_00,"Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    (data_00->state).trailers_bytes_sent = 0;
    Curl_set_in_callback(data_00,true);
    iVar4 = (*(data_00->set).trailer_callback)(&trailers,(data_00->set).trailer_data);
    Curl_set_in_callback(data_00,false);
    if (iVar4 != 0) {
      Curl_failf(data_00,"operation aborted by trailing headers callback");
      *nreadp = 0;
      CVar5 = CURLE_ABORTED_BY_CALLBACK;
LAB_00122113:
      Curl_add_buffer_free(&(data_00->state).trailers_buf);
      curl_slist_free_all(trailers);
      return CVar5;
    }
    CVar5 = Curl_http_compile_trailers(trailers,(data_00->state).trailers_buf,data_00);
    if (CVar5 != CURLE_OK) goto LAB_00122113;
    Curl_infof(data_00,"Successfully compiled trailers.\r\n");
    curl_slist_free_all(trailers);
    tVar6 = (data_00->state).trailers_state;
  }
  if ((tVar6 == TRAILERS_NONE & (data_00->req).upload_chunky) == 1) {
    bytes = bytes - 0xc;
    ppcVar1 = &(data_00->req).upload_fromhere;
    *ppcVar1 = *ppcVar1 + 10;
LAB_00122183:
    pcVar10 = (data_00->state).fread_func;
    pCVar13 = (Curl_easy *)(data_00->state).in;
  }
  else {
    if (tVar6 != TRAILERS_SENDING) goto LAB_00122183;
    pcVar10 = Curl_trailers_read;
    pCVar13 = data_00;
  }
  Curl_set_in_callback(data_00,true);
  sVar8 = (*pcVar10)((data_00->req).upload_fromhere,1,bytes,pCVar13);
  Curl_set_in_callback(data_00,false);
  if (sVar8 == 0x10000001) {
    if ((conn->handler->flags & 0x10) == 0) {
      piVar2 = &(data_00->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 0x20;
      if ((data_00->req).upload_chunky == true) {
        ppcVar1 = &(data_00->req).upload_fromhere;
        *ppcVar1 = *ppcVar1 + -10;
      }
      *nreadp = 0;
      return CURLE_OK;
    }
    pcVar11 = "Read callback asked for PAUSE when not supported!";
LAB_00122232:
    Curl_failf(data_00,pcVar11);
    return CURLE_READ_ERROR;
  }
  if (sVar8 == 0x10000000) {
    Curl_failf(data_00,"operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if (bytes < sVar8) {
    *nreadp = 0;
    pcVar11 = "read function returned funny value";
    goto LAB_00122232;
  }
  sVar14 = sVar8;
  if (((data_00->req).forbidchunk != false) || ((data_00->req).upload_chunky != true))
  goto LAB_001223c7;
  if ((data_00->set).prefer_ascii == false) {
    pcVar11 = "\r\n";
    if ((data_00->set).crlf != false) {
      pcVar11 = "\n";
    }
  }
  else {
    pcVar11 = "\n";
  }
  tVar6 = (data_00->state).trailers_state;
  iVar4 = 0;
  if (tVar6 == TRAILERS_SENDING) {
LAB_00122332:
    if (((data_00->state).trailers_buf)->size_used == (data_00->state).trailers_bytes_sent) {
      Curl_add_buffer_free(&(data_00->state).trailers_buf);
      (data_00->state).trailers_state = TRAILERS_DONE;
      (data_00->set).trailer_data = (void *)0x0;
      (data_00->set).trailer_callback = (curl_trailer_callback)0x0;
      (data_00->req).upload_done = true;
      pcVar12 = "Signaling end of chunked upload after trailers.\n";
LAB_001223ac:
      Curl_infof(data_00,pcVar12);
    }
    else if (sVar14 == (long)iVar4) {
LAB_0012239d:
      (data_00->req).upload_done = true;
      pcVar12 = "Signaling end of chunked upload via terminating chunk.\n";
      goto LAB_001223ac;
    }
    if (tVar6 == TRAILERS_SENDING) goto LAB_001223c7;
  }
  else {
    iVar4 = curl_msnprintf(hexbuffer,0xb,"%zx%s",sVar8);
    sVar9 = (size_t)iVar4;
    pcVar12 = (data_00->req).upload_fromhere + -sVar9;
    (data_00->req).upload_fromhere = pcVar12;
    sVar14 = sVar9 + sVar8;
    memcpy(pcVar12,hexbuffer,sVar9);
    if (((sVar8 == 0) && ((data_00->set).trailer_callback != (curl_trailer_callback)0x0)) &&
       ((data_00->state).trailers_state == TRAILERS_NONE)) {
      (data_00->state).trailers_state = TRAILERS_INITIALIZED;
      goto LAB_001223c7;
    }
    pcVar12 = (data_00->req).upload_fromhere;
    sVar9 = strlen(pcVar11);
    memcpy(pcVar12 + sVar14,pcVar11,sVar9);
    tVar3 = (data_00->state).trailers_state;
    if (tVar3 == TRAILERS_SENDING) goto LAB_00122332;
    if (tVar3 != TRAILERS_INITIALIZED && sVar8 == 0) goto LAB_0012239d;
  }
  sVar9 = strlen(pcVar11);
  sVar14 = sVar14 + sVar9;
LAB_001223c7:
  *nreadp = sVar14;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct connectdata *conn, size_t bytes,
                             size_t *nreadp)
{
  struct Curl_easy *data = conn->data;
  size_t buffersize = bytes;
  size_t nread;

#ifndef CURL_DISABLE_HTTP
  struct curl_slist *trailers = NULL;
  CURLcode c;
  int trailers_ret_code;
#endif

  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;
  bool added_crlf = FALSE;

#ifdef CURL_DOES_CONVERSIONS
  bool sending_http_headers = FALSE;

  if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
    const struct HTTP *http = data->req.protop;

    if(http->sending == HTTPSEND_REQUEST)
      /* We're sending the HTTP request headers, not the data.
         Remember that so we don't re-translate them into garbage. */
      sending_http_headers = TRUE;
  }
#endif

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.\n");
    data->state.trailers_state = TRAILERS_SENDING;
    data->state.trailers_buf = Curl_add_buffer_init();
    if(!data->state.trailers_buf) {
      failf(data, "Unable to allocate trailing headers buffer !");
      return CURLE_OUT_OF_MEMORY;
    }
    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      c = Curl_http_compile_trailers(trailers, data->state.trailers_buf, data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      c = CURLE_ABORTED_BY_CALLBACK;
    }
    if(c != CURLE_OK) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return c;
    }
    infof(data, "Successfully compiled trailers.\r\n");
    curl_slist_free_all(trailers);
  }
#endif

  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we ²have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = Curl_trailers_read;
    extra_data = (void *)data;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  Curl_set_in_callback(data, true);
  nread = readfunc(data->req.upload_fromhere, 1,
                   buffersize, extra_data);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported!");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on set.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    char hexbuffer[11];
    const char *endofline_native;
    const char *endofline_network;
    int hexlen = 0;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->set.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
#ifndef CURL_DISABLE_HTTP
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else
#endif
      {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

#ifdef CURL_DOES_CONVERSIONS
    {
      CURLcode result;
      size_t length;
      if(data->set.prefer_ascii)
        /* translate the protocol and data */
        length = nread;
      else
        /* just translate the protocol portion */
        length = strlen(hexbuffer);
      result = Curl_convert_to_network(data, data->req.upload_fromhere,
                                       length);
      /* Curl_convert_to_network calls failf if unsuccessful */
      if(result)
        return result;
    }
#endif /* CURL_DOES_CONVERSIONS */

#ifndef CURL_DISABLE_HTTP
    if(data->state.trailers_state == TRAILERS_SENDING &&
       !Curl_trailers_left(data)) {
      Curl_add_buffer_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.\n");
    }
    else
#endif
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.\n");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#ifdef CURL_DOES_CONVERSIONS
  else if((data->set.prefer_ascii) && (!sending_http_headers)) {
    CURLcode result;
    result = Curl_convert_to_network(data, data->req.upload_fromhere, nread);
    /* Curl_convert_to_network calls failf if unsuccessful */
    if(result)
      return result;
  }
#endif /* CURL_DOES_CONVERSIONS */

  *nreadp = nread;

  return CURLE_OK;
}